

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

lws_vhost * lws_select_vhost(lws_context *context,int port,char *servername)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint local_40;
  int m;
  int colon;
  int n;
  char *p;
  lws_vhost *vhost;
  char *servername_local;
  int port_local;
  lws_context *context_local;
  
  p = context->vhost_list->proxy_basic_auth_token;
  sVar2 = strlen(servername);
  local_40 = (uint)sVar2;
  pcVar3 = strchr(servername,0x3a);
  if (pcVar3 != (char *)0x0) {
    local_40 = (int)pcVar3 - (int)servername;
  }
  while( true ) {
    if (p == (char *)0x0) {
      p = context->vhost_list->proxy_basic_auth_token;
      while( true ) {
        if (p == (char *)0x0) {
          p = context->vhost_list->proxy_basic_auth_token;
          while( true ) {
            if (p == (char *)0x0) {
              return (lws_vhost *)0x0;
            }
            if ((port != 0) && (port == *(int *)(p + 0x338))) break;
            p = *(char **)(p + 0x1e8);
          }
          _lws_log(8,"%s: vhost match to %s based on port %d\n","lws_select_vhost",
                   *(undefined8 *)(p + 0x210),(ulong)(uint)port);
          return (lws_vhost *)p;
        }
        sVar2 = strlen(*(char **)(p + 0x210));
        iVar1 = (int)sVar2;
        if ((((port != 0) && (port == *(int *)(p + 0x338))) && (iVar1 <= (int)(local_40 - 2))) &&
           ((servername[(int)((local_40 - iVar1) + -1)] == '.' &&
            (iVar1 = strncmp(*(char **)(p + 0x210),servername + ((long)(int)local_40 - (long)iVar1),
                             sVar2 & 0xffffffff), iVar1 == 0)))) break;
        p = *(char **)(p + 0x1e8);
      }
      _lws_log(8,"SNI: Found %s on wildcard: %s\n",servername,*(undefined8 *)(p + 0x210));
      return (lws_vhost *)p;
    }
    if ((port == *(int *)(p + 0x338)) &&
       (iVar1 = strncmp(*(char **)(p + 0x210),servername,(ulong)local_40), iVar1 == 0)) break;
    p = *(char **)(p + 0x1e8);
  }
  _lws_log(8,"SNI: Found: %s\n",servername);
  return (lws_vhost *)p;
}

Assistant:

struct lws_vhost *
lws_select_vhost(struct lws_context *context, int port, const char *servername)
{
	struct lws_vhost *vhost = context->vhost_list;
	const char *p;
	int n, colon;

	n = (int)strlen(servername);
	colon = n;
	p = strchr(servername, ':');
	if (p)
		colon = lws_ptr_diff(p, servername);

	/* Priotity 1: first try exact matches */

	while (vhost) {
		if (port == vhost->listen_port &&
		    !strncmp(vhost->name, servername, (unsigned int)colon)) {
			lwsl_info("SNI: Found: %s\n", servername);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/*
	 * Priority 2: if no exact matches, try matching *.vhost-name
	 * unintentional matches are possible but resolve to x.com for *.x.com
	 * which is reasonable.  If exact match exists we already chose it and
	 * never reach here.  SSL will still fail it if the cert doesn't allow
	 * *.x.com.
	 */
	vhost = context->vhost_list;
	while (vhost) {
		int m = (int)strlen(vhost->name);
		if (port && port == vhost->listen_port &&
		    m <= (colon - 2) &&
		    servername[colon - m - 1] == '.' &&
		    !strncmp(vhost->name, servername + colon - m, (unsigned int)m)) {
			lwsl_info("SNI: Found %s on wildcard: %s\n",
				    servername, vhost->name);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* Priority 3: match the first vhost on our port */

	vhost = context->vhost_list;
	while (vhost) {
		if (port && port == vhost->listen_port) {
			lwsl_info("%s: vhost match to %s based on port %d\n",
					__func__, vhost->name, port);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* no match */

	return NULL;
}